

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_DICEPS.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  time_t tVar2;
  DecPOMDPDiscreteInterface *pDVar3;
  DICEPSPlanner *this;
  ulong uVar4;
  allocator<char> local_2d2;
  allocator<char> local_2d1;
  undefined4 local_2d0;
  undefined2 local_2cc;
  undefined1 local_2ca;
  long *local_2c8;
  shared_count local_2c0 [24];
  double local_2a8;
  Timing Time;
  Arguments args;
  
  ArgumentHandlers::Arguments::Arguments(&args);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&args);
  if (-1 < args.verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"DICE: direct CE Policy Search");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  if (0 < args.verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Horizon = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,args.horizon);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  Timing::Timing(&Time);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"Overall",&local_2d1);
  Timing::Start((string *)&Time);
  std::__cxx11::string::~string((string *)&local_2c8);
  pDVar3 = (DecPOMDPDiscreteInterface *)ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&args);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"PlanningUnit",&local_2d1)
  ;
  Timing::Start((string *)&Time);
  std::__cxx11::string::~string((string *)&local_2c8);
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters
            ((PlanningUnitMADPDiscreteParameters *)&local_2d1);
  PlanningUnitMADPDiscreteParameters::SetComputeAll
            (SUB81((PlanningUnitMADPDiscreteParameters *)&local_2d1,0));
  local_2cc = 0;
  local_2ca = args.sparse != 0;
  local_2d0 = 0x10000;
  this = (DICEPSPlanner *)operator_new(0x3b0);
  DICEPSPlanner::DICEPSPlanner
            (this,(long)args.horizon,pDVar3,1,args.nrCEIterations,args.nrCESamples,
             args.nrCESamplesForUpdate,args.CE_use_hard_threshold,args.CE_alpha,
             args.nrCEEvaluationRuns,(PlanningUnitMADPDiscreteParameters *)&local_2d1,false,
             (ofstream *)0x0,args.verbose);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"PlanningUnit",&local_2d2)
  ;
  Timing::Stop((string *)&Time);
  std::__cxx11::string::~string((string *)&local_2c8);
  if (-1 < args.verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"DICEPSPlanner initialized");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  for (uVar4 = 0; uVar4 < args.nrCERestarts; uVar4 = (ulong)((int)uVar4 + 1)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"Plan",&local_2d2);
    Timing::Start((string *)&Time);
    std::__cxx11::string::~string((string *)&local_2c8);
    (**(code **)(*(long *)this + 0x18))(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"Plan",&local_2d2);
    Timing::Stop((string *)&Time);
    std::__cxx11::string::~string((string *)&local_2c8);
    local_2a8 = (double)(**(code **)(*(long *)this + 0x98))(this);
    std::operator<<((ostream *)&std::cout,"value=");
    poVar1 = std::ostream::_M_insert<double>(local_2a8);
    std::endl<char,std::char_traits<char>>(poVar1);
    if (0 < args.verbose) {
      (**(code **)(*(long *)this + 0xa0))((string *)&local_2c8,this);
      (**(code **)(*local_2c8 + 0x38))();
      boost::detail::shared_count::~shared_count(local_2c0);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"Overall",&local_2d2);
  Timing::Stop((string *)&Time);
  std::__cxx11::string::~string((string *)&local_2c8);
  if (-1 < args.verbose) {
    Timing::PrintSummary();
    TimedAlgorithm::PrintTimersSummary();
  }
  (**(code **)(*(long *)this + 8))(this);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters
            ((PlanningUnitMADPDiscreteParameters *)&local_2d1);
  Timing::~Timing(&Time);
  std::__cxx11::string::~string((string *)&args.maxplus_updateT);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    // parse the command line arguments
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    if(args.verbose >= 0)
        cout << "DICE: direct CE Policy Search"<<endl;

    srand(time(0));

    int horizon = args.horizon;
    if(args.verbose >= 1)
        cout << "Horizon = " << horizon << endl;

    try {
    //start timers
    Timing Time;    
    Time.Start("Overall");

    DecPOMDPDiscreteInterface & decpomdp = * GetDecPOMDPDiscreteInterfaceFromArgs(args);
    
    //Initialization of the planner with typical options for JESP:
    Time.Start("PlanningUnit");
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    params.SetComputeJointActionObservationHistories(false);
    params.SetComputeJointActionHistories(false);
    params.SetComputeIndividualActionObservationHistories(false);
    params.SetComputeIndividualActionHistories(false);
    //params.SetComputeIndividualObservationHistories(false);
    // joint observations histories are needed for
    // efficient computation of joint actions
    params.SetComputeJointObservationHistories(true);
    params.SetComputeJointBeliefs(false);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);
    DICEPSPlanner* planner;
    planner = new DICEPSPlanner (
        horizon,
        &decpomdp,
        //CE params
        1, // the restarts loop is executed here, not in DICEPSPlanner
        args.nrCEIterations,
        args.nrCESamples,
        args.nrCESamplesForUpdate, 
        args.CE_use_hard_threshold, //(gamma in CE papers)
        args.CE_alpha, //the learning rate
        args.nrCEEvaluationRuns, //the number of evaluation runs
        &params, false, 0, args.verbose
    );
    Time.Stop("PlanningUnit");
    if(args.verbose >= 0)
        cout << "DICEPSPlanner initialized" << endl;

    for(Index restartI = 0; restartI < args.nrCERestarts; restartI++)
    {
        Time.Start("Plan");
        planner->Plan();
        Time.Stop("Plan");

        double V = planner->GetExpectedReward();
        cout << "value="<< V << endl;
        if(args.verbose >= 1)
        {
            planner->GetJointPolicyPureVector()->Print();
            cout <<  endl;
        }
    }
    /* clean up */

    Time.Stop("Overall");

    if(args.verbose >= 0)
    {
        Time.PrintSummary();
        planner->PrintTimersSummary();
    }

    delete planner;
    }
    catch(E& e){ e.Print(); }
}